

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

wasm_exporttype_t * wasm_exporttype_new(wasm_name_t *name,wasm_externtype_t *type)

{
  wasm_exporttype_t *this;
  _Head_base<0UL,_wabt::interp::ExternType_*,_false> local_70;
  string local_68;
  ExportType local_48;
  
  this = (wasm_exporttype_t *)operator_new(0x40);
  ToString_abi_cxx11_(&local_68,name);
  (*((type->I)._M_t.
     super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
     ._M_t.
     super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
     .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl)->_vptr_ExternType[2])
            (&local_70);
  std::__cxx11::string::string((string *)&local_48,(string *)&local_68);
  local_48.type._M_t.
  super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>.
  _M_t.
  super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
  .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
        )(__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
          )local_70._M_head_impl;
  local_70._M_head_impl = (ExternType *)0x0;
  wasm_exporttype_t::wasm_exporttype_t(this,&local_48);
  wabt::interp::ExportType::~ExportType(&local_48);
  if (local_70._M_head_impl != (ExternType *)0x0) {
    (*(local_70._M_head_impl)->_vptr_ExternType[1])();
  }
  local_70._M_head_impl = (ExternType *)0x0;
  std::__cxx11::string::_M_dispose();
  return this;
}

Assistant:

own wasm_exporttype_t* wasm_exporttype_new(own wasm_name_t* name,
                                           wasm_externtype_t* type) {
  return new wasm_exporttype_t{ExportType{ToString(name), type->I->Clone()}};
}